

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  GLFWwindow *handle;
  char *pcVar3;
  EVP_PKEY_CTX *ctx;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  long lVar7;
  
  if (1 < argc) {
    iVar5 = 1;
    do {
      pcVar3 = argv[iVar5];
      iVar2 = strcmp("--merl",pcVar3);
      if (iVar2 == 0) {
        ppcVar6 = argv + (long)iVar5 + 1;
        do {
          if (g_sphere.shading.merl.files.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              g_sphere.shading.merl.files.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&g_sphere.shading,
                       (iterator)
                       g_sphere.shading.merl.files.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,ppcVar6);
          }
          else {
            *g_sphere.shading.merl.files.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish = *ppcVar6;
            g_sphere.shading.merl.files.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 g_sphere.shading.merl.files.
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        } while ((iVar5 + 1 < argc) && (**ppcVar6 != '-'));
        fprintf(_stdout,"Note: number of MERL BRDFs set to %i\n",0);
        iVar5 = iVar5 + 1;
LAB_00148f37:
        fflush(_stdout);
      }
      else {
        iVar2 = strcmp("--envmap",pcVar3);
        if (iVar2 == 0) {
          lVar7 = (long)(iVar5 + 1);
          iVar2 = iVar5 + 2;
          if (iVar5 + 2 < argc) {
            iVar2 = argc;
          }
          ppcVar6 = argv + lVar7;
          iVar4 = iVar5 + 1;
          do {
            lVar7 = lVar7 + 1;
            if (g_sphere.shading.envmap.files.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                g_sphere.shading.envmap.files.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char_const*,std::allocator<char_const*>>::
              _M_realloc_insert<char_const*const&>
                        ((vector<char_const*,std::allocator<char_const*>> *)&g_sphere.shading.envmap
                         ,(iterator)
                          g_sphere.shading.envmap.files.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,ppcVar6);
            }
            else {
              *g_sphere.shading.envmap.files.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish = *ppcVar6;
              g_sphere.shading.envmap.files.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   g_sphere.shading.envmap.files.
                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar5 = iVar2;
            if ((long)(ulong)(uint)argc <= lVar7) break;
            ppcVar1 = ppcVar6 + 1;
            ppcVar6 = ppcVar6 + 1;
            iVar5 = iVar4 + 1;
            iVar4 = iVar5;
          } while (**ppcVar1 != '-');
          fprintf(_stdout,"Note: number of Envmaps set to %i\n",0);
          goto LAB_00148f37;
        }
        iVar2 = strcmp("--shader-dir",pcVar3);
        if (iVar2 == 0) {
          g_app.dir.shader = argv[(long)iVar5 + 1];
          pcVar3 = "Note: shader dir set to %s\n";
LAB_00148f0d:
          fprintf(_stdout,pcVar3);
          iVar5 = iVar5 + 1;
          goto LAB_00148f37;
        }
        iVar2 = strcmp("--npf-data",pcVar3);
        if (iVar2 == 0) {
          g_sphere.shading.pathToUberData = argv[(long)iVar5 + 1];
          pcVar3 = "Note: NPF data set to %s\n";
          goto LAB_00148f0d;
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  fwrite("Loading {Window-Main}\n",0x16,1,_stdout);
  fflush(_stdout);
  handle = glfwCreateWindow(0x690,0x41a,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    glfwTerminate();
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetKeyCallback(handle,keyboardCallback);
    glfwSetCursorPosCallback(handle,mouseMotionCallback);
    glfwSetMouseButtonCallback(handle,mouseButtonCallback);
    glfwSetScrollCallback(handle,mouseScrollCallback);
    fwrite("Loading {OpenGL}\n",0x11,1,_stdout);
    fflush(_stdout);
    iVar5 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar5 != 0) {
      fwrite("-- Begin -- Demo\n",0x11,1,_stdout);
      fflush(_stdout);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
      ctx = (EVP_PKEY_CTX *)0x0;
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      init(ctx);
      while (iVar5 = glfwWindowShouldClose(handle), iVar5 == 0) {
        glfwPollEvents();
        (*glad_glClearColor)(0.8,0.8,0.8,1.0);
        (*glad_glClear)(0x4000);
        render();
        glfwSwapBuffers(handle);
      }
      release();
      ImGui_ImplGlfwGL3_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      glfwTerminate();
      fwrite("-- End -- Demo\n",0xf,1,_stdout);
      fflush(_stdout);
      return 0;
    }
    fwrite("gladLoadGLLoader failed\n",0x18,1,_stdout);
    fflush(_stdout);
  }
  return -1;
}

Assistant:

int main(int argc, const char **argv)
{
    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--merl", argv[i])) {
            int cnt = 0;

            ++i;
            do {
                g_sphere.shading.merl.files.push_back(argv[i]);
            } while ((cnt < argc-i) && strncmp("-", argv[i+cnt], 1));
            LOG("Note: number of MERL BRDFs set to %i\n", cnt);
        } else if (!strcmp("--envmap", argv[i])) {
            int cnt = 0;

            ++i;
            do {
                g_sphere.shading.envmap.files.push_back(argv[i]);
                ++i;
            } while ((cnt < argc-i) && strncmp("-", argv[i], 1));
            LOG("Note: number of Envmaps set to %i\n", cnt);
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = argv[++i];
            LOG("Note: shader dir set to %s\n", g_app.dir.shader);
        } else if (!strcmp("--npf-data", argv[i])) {
            g_sphere.shading.pathToUberData = argv[++i];
            LOG("Note: NPF data set to %s\n", g_sphere.shading.pathToUberData);
        }
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window)) {
            glfwPollEvents();

            glClearColor(0.8, 0.8, 0.8, 1.0);
            glClear(GL_COLOR_BUFFER_BIT);

            render();

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}